

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parserInternals.c
# Opt level: O1

xmlParserInputPtr xmlNewPushInput(char *url,char *chunk,int size)

{
  int iVar1;
  xmlParserInputBufferPtr buf;
  xmlParserInputPtr input;
  
  buf = xmlAllocParserInputBuffer(XML_CHAR_ENCODING_NONE);
  if (buf == (xmlParserInputBufferPtr)0x0) {
    return (xmlParserInputPtr)0x0;
  }
  input = xmlNewInputInternal(buf,url);
  if (input != (xmlParserInputPtr)0x0) {
    *(byte *)&input->flags = (byte)input->flags | 0x40;
    if (chunk == (char *)0x0 || size < 1) {
      return input;
    }
    iVar1 = xmlParserInputBufferPush(input->buf,size,chunk);
    xmlBufResetInput(input->buf->buffer,input);
    if (-1 < iVar1) {
      return input;
    }
    xmlFreeInputStream(input);
  }
  return (xmlParserInputPtr)0x0;
}

Assistant:

xmlParserInputPtr
xmlNewPushInput(const char *url, const char *chunk, int size) {
    xmlParserInputBufferPtr buf;
    xmlParserInputPtr input;

    buf = xmlAllocParserInputBuffer(XML_CHAR_ENCODING_NONE);
    if (buf == NULL)
        return(NULL);

    input = xmlNewInputInternal(buf, url);
    if (input == NULL)
	return(NULL);

    input->flags |= XML_INPUT_PROGRESSIVE;

    if ((size > 0) && (chunk != NULL)) {
        int res;

	res = xmlParserInputBufferPush(input->buf, size, chunk);
        xmlBufResetInput(input->buf->buffer, input);
        if (res < 0) {
            xmlFreeInputStream(input);
            return(NULL);
        }
    }

    return(input);
}